

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btRigidBody.cpp
# Opt level: O3

char * __thiscall
btRigidBody::serialize(btRigidBody *this,void *dataBuffer,btSerializer *serializer)

{
  undefined4 uVar1;
  undefined4 uVar2;
  btScalar bVar3;
  btScalar bVar4;
  undefined8 uVar5;
  int i_2;
  undefined1 *puVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  
  btCollisionObject::serialize(&this->super_btCollisionObject,dataBuffer,serializer);
  puVar6 = &(this->super_btCollisionObject).field_0x14c;
  lVar7 = (long)dataBuffer + 0x110;
  lVar8 = 0;
  do {
    lVar9 = 0;
    do {
      *(undefined4 *)(lVar7 + lVar9 * 4) = *(undefined4 *)(puVar6 + lVar9 * 4);
      lVar9 = lVar9 + 1;
    } while (lVar9 != 4);
    lVar8 = lVar8 + 1;
    lVar7 = lVar7 + 0x10;
    puVar6 = puVar6 + 0x10;
  } while (lVar8 != 3);
  lVar7 = 0;
  do {
    *(btScalar *)((long)dataBuffer + lVar7 * 4 + 0x140) = (this->m_linearVelocity).m_floats[lVar7];
    lVar7 = lVar7 + 1;
  } while (lVar7 != 4);
  lVar7 = 0;
  do {
    *(btScalar *)((long)dataBuffer + lVar7 * 4 + 0x150) = (this->m_angularVelocity).m_floats[lVar7];
    lVar7 = lVar7 + 1;
  } while (lVar7 != 4);
  *(btScalar *)((long)dataBuffer + 0x1d0) = this->m_inverseMass;
  lVar7 = 0;
  do {
    *(btScalar *)((long)dataBuffer + lVar7 * 4 + 0x160) = (this->m_angularFactor).m_floats[lVar7];
    lVar7 = lVar7 + 1;
  } while (lVar7 != 4);
  lVar7 = 0;
  do {
    *(btScalar *)((long)dataBuffer + lVar7 * 4 + 0x170) = (this->m_linearFactor).m_floats[lVar7];
    lVar7 = lVar7 + 1;
  } while (lVar7 != 4);
  lVar7 = 0;
  do {
    *(btScalar *)((long)dataBuffer + lVar7 * 4 + 0x180) = (this->m_gravity).m_floats[lVar7];
    lVar7 = lVar7 + 1;
  } while (lVar7 != 4);
  lVar7 = 0;
  do {
    *(btScalar *)((long)dataBuffer + lVar7 * 4 + 400) =
         (this->m_gravity_acceleration).m_floats[lVar7];
    lVar7 = lVar7 + 1;
  } while (lVar7 != 4);
  lVar7 = 0;
  do {
    *(btScalar *)((long)dataBuffer + lVar7 * 4 + 0x1a0) = (this->m_invInertiaLocal).m_floats[lVar7];
    lVar7 = lVar7 + 1;
  } while (lVar7 != 4);
  lVar7 = 0;
  do {
    *(btScalar *)((long)dataBuffer + lVar7 * 4 + 0x1b0) = (this->m_totalForce).m_floats[lVar7];
    lVar7 = lVar7 + 1;
  } while (lVar7 != 4);
  lVar7 = 0;
  do {
    *(btScalar *)((long)dataBuffer + lVar7 * 4 + 0x1c0) = (this->m_totalTorque).m_floats[lVar7];
    lVar7 = lVar7 + 1;
  } while (lVar7 != 4);
  bVar3 = this->m_linearDamping;
  bVar4 = this->m_angularDamping;
  *(uint *)((long)dataBuffer + 500) = (uint)this->m_additionalDamping;
  uVar1 = this->m_additionalDampingFactor;
  uVar2 = this->m_additionalLinearDampingThresholdSqr;
  *(btScalar *)((long)dataBuffer + 0x1d4) = bVar3;
  *(btScalar *)((long)dataBuffer + 0x1d8) = bVar4;
  *(undefined4 *)((long)dataBuffer + 0x1dc) = uVar1;
  *(undefined4 *)((long)dataBuffer + 0x1e0) = uVar2;
  uVar5 = *(undefined8 *)&this->m_linearSleepingThreshold;
  *(undefined8 *)((long)dataBuffer + 0x1e4) =
       *(undefined8 *)&this->m_additionalAngularDampingThresholdSqr;
  *(undefined8 *)((long)dataBuffer + 0x1ec) = uVar5;
  return "btRigidBodyFloatData";
}

Assistant:

const char*	btRigidBody::serialize(void* dataBuffer, class btSerializer* serializer) const
{
	btRigidBodyData* rbd = (btRigidBodyData*) dataBuffer;

	btCollisionObject::serialize(&rbd->m_collisionObjectData, serializer);

	m_invInertiaTensorWorld.serialize(rbd->m_invInertiaTensorWorld);
	m_linearVelocity.serialize(rbd->m_linearVelocity);
	m_angularVelocity.serialize(rbd->m_angularVelocity);
	rbd->m_inverseMass = m_inverseMass;
	m_angularFactor.serialize(rbd->m_angularFactor);
	m_linearFactor.serialize(rbd->m_linearFactor);
	m_gravity.serialize(rbd->m_gravity);
	m_gravity_acceleration.serialize(rbd->m_gravity_acceleration);
	m_invInertiaLocal.serialize(rbd->m_invInertiaLocal);
	m_totalForce.serialize(rbd->m_totalForce);
	m_totalTorque.serialize(rbd->m_totalTorque);
	rbd->m_linearDamping = m_linearDamping;
	rbd->m_angularDamping = m_angularDamping;
	rbd->m_additionalDamping = m_additionalDamping;
	rbd->m_additionalDampingFactor = m_additionalDampingFactor;
	rbd->m_additionalLinearDampingThresholdSqr = m_additionalLinearDampingThresholdSqr;
	rbd->m_additionalAngularDampingThresholdSqr = m_additionalAngularDampingThresholdSqr;
	rbd->m_additionalAngularDampingFactor = m_additionalAngularDampingFactor;
	rbd->m_linearSleepingThreshold=m_linearSleepingThreshold;
	rbd->m_angularSleepingThreshold = m_angularSleepingThreshold;

	return btRigidBodyDataName;
}